

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_threads.c
# Opt level: O3

ares_thread_mutex_t * ares_thread_mutex_create(void)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_c;
  
  __mutex = (pthread_mutex_t *)ares_malloc_zero(0x28);
  if (__mutex != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutexattr_init(&local_c);
    if (iVar1 == 0) {
      iVar1 = pthread_mutexattr_settype(&local_c,1);
      if ((iVar1 == 0) && (iVar1 = pthread_mutex_init(__mutex,&local_c), iVar1 == 0)) {
        pthread_mutexattr_destroy(&local_c);
        return (ares_thread_mutex_t *)__mutex;
      }
      pthread_mutexattr_destroy(&local_c);
    }
    ares_free(__mutex);
  }
  return (ares_thread_mutex_t *)0x0;
}

Assistant:

ares_thread_mutex_t *ares_thread_mutex_create(void)
{
  pthread_mutexattr_t  attr;
  ares_thread_mutex_t *mut = ares_malloc_zero(sizeof(*mut));
  if (mut == NULL) {
    return NULL;
  }

  if (pthread_mutexattr_init(&attr) != 0) {
    ares_free(mut); /* LCOV_EXCL_LINE: UntestablePath */
    return NULL;    /* LCOV_EXCL_LINE: UntestablePath */
  }

  if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE) != 0) {
    goto fail; /* LCOV_EXCL_LINE: UntestablePath */
  }

  if (pthread_mutex_init(&mut->mutex, &attr) != 0) {
    goto fail; /* LCOV_EXCL_LINE: UntestablePath */
  }

  pthread_mutexattr_destroy(&attr);
  return mut;

/* LCOV_EXCL_START: UntestablePath */
fail:
  pthread_mutexattr_destroy(&attr);
  ares_free(mut);
  return NULL;
  /* LCOV_EXCL_STOP */
}